

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O0

light_pcapng_stream light_open_stream(char *file_name)

{
  light_pcapng_stream __ptr;
  __fd_t pFVar1;
  light_pcapng_stream pcapng;
  undefined8 in_stack_fffffffffffffff8;
  __read_mode_t mode;
  
  mode = (__read_mode_t)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  __ptr = (light_pcapng_stream)calloc(1,0x18);
  pFVar1 = light_open((char *)pcapng,mode);
  (__ptr->stream).fd = pFVar1;
  if ((__ptr->stream).fd == (__fd_t)0x0) {
    free(__ptr);
    __ptr = (light_pcapng_stream)0x0;
  }
  else {
    __ptr->valid = 1;
  }
  return __ptr;
}

Assistant:

light_pcapng_stream light_open_stream(const char *file_name)
{
	light_pcapng_stream pcapng = calloc(1, sizeof(struct _light_pcapng_stream));
	pcapng->stream.fd = light_open(file_name, LIGHT_OREAD);

	if (pcapng->stream.fd == NULL) {
		free(pcapng);
		return NULL;
	}

	pcapng->valid = 1;
	return pcapng;
}